

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
::
nosize_unchecked_emplace_at<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>&&,std::shared_ptr<slang::ast::SystemSubroutine>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SymbolKind>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>_&&,_std::shared_ptr<slang::ast::SystemSubroutine>_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> *ptVar4;
  shared_ptr<slang::ast::SystemSubroutine> *psVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  char *pcVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  long lVar12;
  long lVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pgVar3 = arrays_->groups_;
  lVar12 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar15[0] = -(pgVar1->m[0].n == '\0');
  auVar15[1] = -(pgVar1->m[1].n == '\0');
  auVar15[2] = -(pgVar1->m[2].n == '\0');
  auVar15[3] = -(pgVar1->m[3].n == '\0');
  auVar15[4] = -(pgVar1->m[4].n == '\0');
  auVar15[5] = -(pgVar1->m[5].n == '\0');
  auVar15[6] = -(pgVar1->m[6].n == '\0');
  auVar15[7] = -(pgVar1->m[7].n == '\0');
  auVar15[8] = -(pgVar1->m[8].n == '\0');
  auVar15[9] = -(pgVar1->m[9].n == '\0');
  auVar15[10] = -(pgVar1->m[10].n == '\0');
  auVar15[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar15[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar15[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar15[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar15[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar14 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
  if (uVar14 == 0) {
    uVar6 = arrays_->groups_size_mask;
    lVar13 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar13 & uVar6;
      lVar12 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar16[0] = -(pgVar1->m[0].n == '\0');
      auVar16[1] = -(pgVar1->m[1].n == '\0');
      auVar16[2] = -(pgVar1->m[2].n == '\0');
      auVar16[3] = -(pgVar1->m[3].n == '\0');
      auVar16[4] = -(pgVar1->m[4].n == '\0');
      auVar16[5] = -(pgVar1->m[5].n == '\0');
      auVar16[6] = -(pgVar1->m[6].n == '\0');
      auVar16[7] = -(pgVar1->m[7].n == '\0');
      auVar16[8] = -(pgVar1->m[8].n == '\0');
      auVar16[9] = -(pgVar1->m[9].n == '\0');
      auVar16[10] = -(pgVar1->m[10].n == '\0');
      auVar16[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar16[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar16[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar16[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar16[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar8 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe;
      uVar14 = (uint)uVar8;
      lVar13 = lVar13 + 1;
    } while (uVar8 == 0);
  }
  uVar7 = 0;
  if (uVar14 != 0) {
    for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar7;
  ptVar4 = args->first;
  (ppVar2->first).
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (ptVar4->
       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
       ).super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
       super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl;
  pcVar9 = (ptVar4->
           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
           ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
           _M_head_impl._M_str;
  (ppVar2->first).
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (ptVar4->
           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
           ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
           _M_head_impl._M_len;
  (ppVar2->first).
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = pcVar9;
  psVar5 = args->second;
  (ppVar2->second).super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar10 = (psVar5->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var11 = (psVar5->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (psVar5->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (ppVar2->second).super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar10;
  (ppVar2->second).super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var11;
  (psVar5->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (pgVar3->m + lVar12)[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar12);
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }